

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_muxer_metadata.cc
# Opt level: O1

void SampleMuxerMetadata::WriteCueSettings(settings_t *settings,string *pf)

{
  _List_node_base *p_Var1;
  char cVar2;
  _Self __tmp;
  _List_node_base *p_Var3;
  
  p_Var3 = (settings->super__List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  cVar2 = (char)pf;
  if (p_Var3 != (_List_node_base *)settings) {
    while( true ) {
      p_Var1 = (((_List_base<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_> *)
                &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      std::__cxx11::string::_M_append((char *)pf,(ulong)p_Var3[1]._M_next);
      std::__cxx11::string::push_back(cVar2);
      std::__cxx11::string::_M_append((char *)pf,(ulong)p_Var3[3]._M_next);
      if (p_Var1 == (_List_node_base *)settings) break;
      std::__cxx11::string::push_back(cVar2);
      p_Var3 = p_Var1;
    }
  }
  std::__cxx11::string::push_back(cVar2);
  return;
}

Assistant:

void SampleMuxerMetadata::WriteCueSettings(const cue_t::settings_t& settings,
                                           std::string* pf) {
  if (settings.empty()) {
    pf->push_back('\x0A');  // LF
    return;
  }

  typedef cue_t::settings_t::const_iterator iter_t;

  iter_t i = settings.begin();
  const iter_t j = settings.end();

  for (;;) {
    const libwebvtt::Setting& setting = *i++;

    pf->append(setting.name);
    pf->push_back(':');
    pf->append(setting.value);

    if (i == j)
      break;

    pf->push_back(' ');  // separate settings with whitespace
  }

  pf->push_back('\x0A');  // LF
}